

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

void detail::AddCustomCommandToTarget
               (cmLocalGenerator *lg,cmCommandOrigin origin,cmTarget *target,
               cmCustomCommandType type,
               unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *cc)

{
  pointer pcVar1;
  string *target_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *byproducts;
  cmListFileBacktrace *bt;
  type pcVar2;
  unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *cc_local;
  cmCustomCommandType type_local;
  cmTarget *target_local;
  cmCommandOrigin origin_local;
  cmLocalGenerator *lg_local;
  
  pcVar1 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->(cc);
  cmCustomCommand::SetEscapeAllowMakeVars(pcVar1,true);
  pcVar1 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->(cc);
  target_00 = cmTarget::GetName_abi_cxx11_(target);
  cmCustomCommand::SetTarget(pcVar1,target_00);
  pcVar1 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->(cc);
  byproducts = cmCustomCommand::GetByproducts_abi_cxx11_(pcVar1);
  pcVar1 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->(cc);
  bt = cmCustomCommand::GetBacktrace(pcVar1);
  cmLocalGenerator::AddTargetByproducts(lg,target,byproducts,bt,origin);
  if (type == PRE_BUILD) {
    pcVar2 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator*(cc);
    cmTarget::AddPreBuildCommand(target,pcVar2);
  }
  else if (type == PRE_LINK) {
    pcVar2 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator*(cc);
    cmTarget::AddPreLinkCommand(target,pcVar2);
  }
  else if (type == POST_BUILD) {
    pcVar2 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator*(cc);
    cmTarget::AddPostBuildCommand(target,pcVar2);
  }
  std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::reset(cc,(pointer)0x0);
  return;
}

Assistant:

void AddCustomCommandToTarget(cmLocalGenerator& lg, cmCommandOrigin origin,
                              cmTarget* target, cmCustomCommandType type,
                              std::unique_ptr<cmCustomCommand> cc)
{
  // Add the command to the appropriate build step for the target.
  cc->SetEscapeAllowMakeVars(true);
  cc->SetTarget(target->GetName());

  lg.AddTargetByproducts(target, cc->GetByproducts(), cc->GetBacktrace(),
                         origin);

  switch (type) {
    case cmCustomCommandType::PRE_BUILD:
      target->AddPreBuildCommand(std::move(*cc));
      break;
    case cmCustomCommandType::PRE_LINK:
      target->AddPreLinkCommand(std::move(*cc));
      break;
    case cmCustomCommandType::POST_BUILD:
      target->AddPostBuildCommand(std::move(*cc));
      break;
  }

  cc.reset();
}